

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

void boost::detail::add_new_tss_node
               (void *key,shared_ptr<boost::detail::tss_cleanup_function> *func,void *tss_data)

{
  thread_data_base *ptVar1;
  shared_count local_68;
  undefined8 local_60;
  shared_count sStack_58;
  void *local_50;
  pair<const_void_*,_boost::detail::tss_data_node> local_48;
  
  ptVar1 = get_current_thread_data();
  if (ptVar1 == (thread_data_base *)0x0) {
    ptVar1 = make_external_thread_data();
  }
  local_48.second.func.px = func->px;
  local_68.pi_ = (func->pn).pi_;
  if (local_68.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_68.pi_)->use_count_ = (local_68.pi_)->use_count_ + 1;
    UNLOCK();
    LOCK();
    (local_68.pi_)->use_count_ = (local_68.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_60 = 0;
  sStack_58.pi_ = (sp_counted_base *)0x0;
  local_50 = tss_data;
  local_48.first = key;
  local_48.second.func.pn.pi_ = local_68.pi_;
  local_48.second.value = tss_data;
  std::
  _Rb_tree<void_const*,std::pair<void_const*const,boost::detail::tss_data_node>,std::_Select1st<std::pair<void_const*const,boost::detail::tss_data_node>>,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
  ::_M_emplace_unique<std::pair<void_const*,boost::detail::tss_data_node>>
            ((_Rb_tree<void_const*,std::pair<void_const*const,boost::detail::tss_data_node>,std::_Select1st<std::pair<void_const*const,boost::detail::tss_data_node>>,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
              *)&ptVar1->tss_data,&local_48);
  shared_count::~shared_count(&local_48.second.func.pn);
  shared_count::~shared_count(&sStack_58);
  shared_count::~shared_count(&local_68);
  return;
}

Assistant:

void add_new_tss_node(void const* key,
                              boost::shared_ptr<tss_cleanup_function> func,
                              void* tss_data)
        {
            detail::thread_data_base* const current_thread_data(get_or_make_current_thread_data());
            current_thread_data->tss_data.insert(std::make_pair(key,tss_data_node(func,tss_data)));
        }